

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O3

void __thiscall
TEST_TestRegistry_nameFilterWorks_Test::testBody(TEST_TestRegistry_nameFilterWorks_Test *this)

{
  byte bVar1;
  TestRegistry *pTVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  TestFilter nameFilter;
  
  UtestShell::setTestName
            (&((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1)->super_UtestShell,
             "testname");
  UtestShell::setTestName
            (&((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2)->super_UtestShell,"noname")
  ;
  TestFilter::TestFilter(&nameFilter,"testname");
  pTVar2 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar2->_vptr_TestRegistry[0xb])(pTVar2,&nameFilter);
  TEST_GROUP_CppUTestGroupTestRegistry::addAndRunAllTests
            (&this->super_TEST_GROUP_CppUTestGroupTestRegistry);
  pUVar3 = UtestShell::getCurrent();
  bVar1 = (((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test1)->super_UtestShell).field_0x32;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)bVar1,"CHECK","test1->hasRun_",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x111,pTVar4);
  pUVar3 = UtestShell::getCurrent();
  bVar1 = (((this->super_TEST_GROUP_CppUTestGroupTestRegistry).test2)->super_UtestShell).field_0x32;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(bVar1 ^ 1),"CHECK","!test2->hasRun_",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x112,pTVar4);
  SimpleString::~SimpleString(&nameFilter.filter_);
  return;
}

Assistant:

TEST(TestRegistry, nameFilterWorks)
{
    test1->setTestName("testname");
    test2->setTestName("noname");
    TestFilter nameFilter("testname");
    myRegistry->setNameFilters(&nameFilter);
    addAndRunAllTests();
    CHECK(test1->hasRun_);
    CHECK(!test2->hasRun_);
}